

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O3

void pass2_fs_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  JDIMENSION JVar4;
  jpeg_color_quantizer *pjVar5;
  _func_void_j_decompress_ptr *p_Var6;
  _func_void_j_decompress_ptr *p_Var7;
  JSAMPLE *pJVar8;
  JSAMPARRAY ppJVar9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  short sVar17;
  int iVar18;
  uint c2;
  long lVar19;
  int iVar20;
  int iVar21;
  JDIMENSION JVar22;
  ulong uVar23;
  short sVar24;
  ushort uVar26;
  JSAMPROW pJVar27;
  byte *pbVar28;
  short sVar29;
  int iVar31;
  int iVar32;
  _func_void_j_decompress_ptr_boolean *p_Var33;
  bool bVar34;
  int local_fc;
  int local_f8;
  int local_f4;
  long local_d0;
  JSAMPROW local_c8;
  int iVar25;
  int iVar30;
  
  if (0 < num_rows) {
    pjVar5 = cinfo->cquantize;
    p_Var6 = pjVar5[1].finish_pass;
    p_Var7 = pjVar5[2].finish_pass;
    JVar4 = cinfo->output_width;
    pJVar8 = cinfo->sample_range_limit;
    ppJVar9 = cinfo->colormap;
    pJVar10 = *ppJVar9;
    pJVar11 = ppJVar9[1];
    pJVar12 = ppJVar9[2];
    uVar23 = 0;
    do {
      pJVar27 = input_buf[uVar23];
      local_c8 = output_buf[uVar23];
      bVar34 = *(int *)&pjVar5[2].color_quantize == 0;
      if (bVar34) {
        p_Var33 = pjVar5[2].start_pass;
        iVar18 = 3;
        local_d0 = 1;
      }
      else {
        pJVar27 = pJVar27 + (JVar4 * 3 - 3);
        p_Var33 = pjVar5[2].start_pass + (ulong)(JVar4 * 3 + 3) * 2;
        local_c8 = local_c8 + (JVar4 - 1);
        iVar18 = -3;
        local_d0 = -1;
      }
      iVar14 = 0;
      sVar29 = 0;
      *(uint *)&pjVar5[2].color_quantize = (uint)bVar34;
      if (JVar4 == 0) {
        sVar24 = 0;
        sVar17 = 0;
      }
      else {
        lVar19 = (long)iVar18;
        pbVar28 = pJVar27 + 2;
        iVar18 = 0;
        iVar20 = 0;
        local_fc = 0;
        local_f8 = 0;
        local_f4 = 0;
        iVar15 = 0;
        iVar25 = 0;
        iVar30 = 0;
        JVar22 = JVar4;
        do {
          bVar1 = pJVar8[(ulong)pbVar28[-2] +
                         (long)*(int *)(p_Var7 + (long)(iVar14 + *(short *)(p_Var33 + lVar19 * 2) +
                                                        8 >> 4) * 4)];
          bVar2 = pJVar8[(ulong)pbVar28[-1] +
                         (long)*(int *)(p_Var7 + (long)(iVar18 + *(short *)(p_Var33 +
                                                                           (lVar19 + 1) * 2) + 8 >>
                                                       4) * 4)];
          bVar3 = pJVar8[(ulong)*pbVar28 +
                         (long)*(int *)(p_Var7 + (long)(iVar20 + *(short *)(p_Var33 +
                                                                           (lVar19 + 2) * 2) + 8 >>
                                                       4) * 4)];
          bVar13 = bVar2 >> 2;
          c2 = (uint)(bVar3 >> 3);
          lVar16 = (ulong)bVar13 * 0x40 + *(long *)(p_Var6 + (bVar1 & 0xfffffff8));
          uVar26 = *(ushort *)(lVar16 + (ulong)c2 * 2);
          if (uVar26 == 0) {
            fill_inverse_cmap(cinfo,(uint)(bVar1 >> 3),(uint)bVar13,c2);
            uVar26 = *(ushort *)(lVar16 + (ulong)c2 * 2);
          }
          *local_c8 = (char)uVar26 + 0xff;
          iVar32 = (uint)bVar1 - (uint)pJVar10[(ulong)uVar26 - 1];
          iVar21 = (uint)bVar2 - (uint)pJVar11[(ulong)uVar26 - 1];
          iVar31 = (uint)bVar3 - (uint)pJVar12[(ulong)uVar26 - 1];
          *(short *)p_Var33 = (short)iVar32 * 3 + (short)iVar15;
          iVar15 = iVar32 * 5 + local_fc;
          iVar14 = iVar32 * 7;
          *(short *)(p_Var33 + 2) = (short)iVar21 * 3 + (short)iVar25;
          iVar25 = iVar21 * 5 + local_f8;
          sVar24 = (short)iVar25;
          iVar18 = iVar21 * 7;
          *(short *)(p_Var33 + 4) = (short)iVar31 * 3 + (short)iVar30;
          iVar30 = iVar31 * 5 + local_f4;
          sVar29 = (short)iVar30;
          iVar20 = iVar31 * 7;
          local_c8 = local_c8 + local_d0;
          pbVar28 = pbVar28 + lVar19;
          p_Var33 = p_Var33 + lVar19 * 2;
          JVar22 = JVar22 - 1;
          local_fc = iVar32;
          local_f8 = iVar21;
          local_f4 = iVar31;
        } while (JVar22 != 0);
        sVar17 = (short)iVar15;
      }
      *(short *)p_Var33 = sVar17;
      *(short *)(p_Var33 + 2) = sVar24;
      *(short *)(p_Var33 + 4) = sVar29;
      uVar23 = uVar23 + 1;
    } while (uVar23 != (uint)num_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
pass2_fs_dither(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPARRAY output_buf, int num_rows)
/* This version performs Floyd-Steinberg dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  register LOCFSERROR cur0, cur1, cur2; /* current error or pixel value */
  LOCFSERROR belowerr0, belowerr1, belowerr2; /* error for pixel below cur */
  LOCFSERROR bpreverr0, bpreverr1, bpreverr2; /* error for below/prev col */
  register FSERRPTR errorptr;   /* => fserrors[] at column before current */
  JSAMPROW inptr;               /* => current input pixel */
  JSAMPROW outptr;              /* => current output pixel */
  histptr cachep;
  int dir;                      /* +1 or -1 depending on direction */
  int dir3;                     /* 3*dir, for advancing inptr & errorptr */
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;
  JSAMPLE *range_limit = cinfo->sample_range_limit;
  int *error_limit = cquantize->error_limiter;
  JSAMPROW colormap0 = cinfo->colormap[0];
  JSAMPROW colormap1 = cinfo->colormap[1];
  JSAMPROW colormap2 = cinfo->colormap[2];
  SHIFT_TEMPS

  for (row = 0; row < num_rows; row++) {
    inptr = input_buf[row];
    outptr = output_buf[row];
    if (cquantize->on_odd_row) {
      /* work right to left in this row */
      inptr += (width - 1) * 3; /* so point to rightmost pixel */
      outptr += width - 1;
      dir = -1;
      dir3 = -3;
      errorptr = cquantize->fserrors + (width + 1) * 3; /* => entry after last column */
      cquantize->on_odd_row = FALSE; /* flip for next time */
    } else {
      /* work left to right in this row */
      dir = 1;
      dir3 = 3;
      errorptr = cquantize->fserrors; /* => entry before first real column */
      cquantize->on_odd_row = TRUE; /* flip for next time */
    }
    /* Preset error values: no error propagated to first pixel from left */
    cur0 = cur1 = cur2 = 0;
    /* and no error propagated to row below yet */
    belowerr0 = belowerr1 = belowerr2 = 0;
    bpreverr0 = bpreverr1 = bpreverr2 = 0;

    for (col = width; col > 0; col--) {
      /* curN holds the error propagated from the previous pixel on the
       * current line.  Add the error propagated from the previous line
       * to form the complete error correction term for this pixel, and
       * round the error term (which is expressed * 16) to an integer.
       * RIGHT_SHIFT rounds towards minus infinity, so adding 8 is correct
       * for either sign of the error value.
       * Note: errorptr points to *previous* column's array entry.
       */
      cur0 = RIGHT_SHIFT(cur0 + errorptr[dir3 + 0] + 8, 4);
      cur1 = RIGHT_SHIFT(cur1 + errorptr[dir3 + 1] + 8, 4);
      cur2 = RIGHT_SHIFT(cur2 + errorptr[dir3 + 2] + 8, 4);
      /* Limit the error using transfer function set by init_error_limit.
       * See comments with init_error_limit for rationale.
       */
      cur0 = error_limit[cur0];
      cur1 = error_limit[cur1];
      cur2 = error_limit[cur2];
      /* Form pixel value + error, and range-limit to 0..MAXJSAMPLE.
       * The maximum error is +- MAXJSAMPLE (or less with error limiting);
       * this sets the required size of the range_limit array.
       */
      cur0 += inptr[0];
      cur1 += inptr[1];
      cur2 += inptr[2];
      cur0 = range_limit[cur0];
      cur1 = range_limit[cur1];
      cur2 = range_limit[cur2];
      /* Index into the cache with adjusted pixel value */
      cachep =
        &histogram[cur0 >> C0_SHIFT][cur1 >> C1_SHIFT][cur2 >> C2_SHIFT];
      /* If we have not seen this color before, find nearest colormap */
      /* entry and update the cache */
      if (*cachep == 0)
        fill_inverse_cmap(cinfo, cur0 >> C0_SHIFT, cur1 >> C1_SHIFT,
                          cur2 >> C2_SHIFT);
      /* Now emit the colormap index for this cell */
      {
        register int pixcode = *cachep - 1;
        *outptr = (JSAMPLE)pixcode;
        /* Compute representation error for this pixel */
        cur0 -= colormap0[pixcode];
        cur1 -= colormap1[pixcode];
        cur2 -= colormap2[pixcode];
      }
      /* Compute error fractions to be propagated to adjacent pixels.
       * Add these into the running sums, and simultaneously shift the
       * next-line error sums left by 1 column.
       */
      {
        register LOCFSERROR bnexterr;

        bnexterr = cur0;        /* Process component 0 */
        errorptr[0] = (FSERROR)(bpreverr0 + cur0 * 3);
        bpreverr0 = belowerr0 + cur0 * 5;
        belowerr0 = bnexterr;
        cur0 *= 7;
        bnexterr = cur1;        /* Process component 1 */
        errorptr[1] = (FSERROR)(bpreverr1 + cur1 * 3);
        bpreverr1 = belowerr1 + cur1 * 5;
        belowerr1 = bnexterr;
        cur1 *= 7;
        bnexterr = cur2;        /* Process component 2 */
        errorptr[2] = (FSERROR)(bpreverr2 + cur2 * 3);
        bpreverr2 = belowerr2 + cur2 * 5;
        belowerr2 = bnexterr;
        cur2 *= 7;
      }
      /* At this point curN contains the 7/16 error value to be propagated
       * to the next pixel on the current line, and all the errors for the
       * next line have been shifted over.  We are therefore ready to move on.
       */
      inptr += dir3;            /* Advance pixel pointers to next column */
      outptr += dir;
      errorptr += dir3;         /* advance errorptr to current column */
    }
    /* Post-loop cleanup: we must unload the final error values into the
     * final fserrors[] entry.  Note we need not unload belowerrN because
     * it is for the dummy column before or after the actual array.
     */
    errorptr[0] = (FSERROR)bpreverr0; /* unload prev errs into array */
    errorptr[1] = (FSERROR)bpreverr1;
    errorptr[2] = (FSERROR)bpreverr2;
  }
}